

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void accumulate_gop_stats
               (AV1_COMP *cpi,int is_intra_only,int f_w,int f_h,FIRSTPASS_STATS *next_frame,
               FIRSTPASS_STATS *start_pos,GF_GROUP_STATS *gf_stats,int *idx)

{
  int iVar1;
  FIRSTPASS_STATS *stats;
  undefined4 in_ECX;
  int in_ESI;
  long *in_RDI;
  FIRSTPASS_STATS *in_R8;
  FIRSTPASS_STATS *in_R9;
  double mod_frame_err;
  AV1EncoderConfig *oxcf;
  FRAME_INFO *frame_info;
  RATE_CONTROL *rc;
  PRIMARY_RATE_CONTROL *p_rc;
  TWO_PASS *twopass;
  int flash_detected;
  int i;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  AV1EncoderConfig *in_stack_ffffffffffffffa0;
  TWO_PASS *p;
  TWO_PASS *twopass_00;
  long *plVar2;
  int local_2c;
  
  stats = (FIRSTPASS_STATS *)(*in_RDI + 0x8b30);
  plVar2 = in_RDI + 0xc0ee;
  twopass_00 = (TWO_PASS *)(in_RDI + 0xe259);
  p = (TWO_PASS *)(in_RDI + 0x8464);
  init_gf_stats((GF_GROUP_STATS *)mod_frame_err);
  memset(in_R8,0,0xe8);
  local_2c = in_ESI;
  while ((local_2c <
          *(int *)((long)&stats->intra_error + (long)*(int *)((long)&stats->pcnt_neutral + 4) * 4)
         && (iVar1 = input_stats(p,(TWO_PASS_FRAME *)in_stack_ffffffffffffffa0,
                                 (FIRSTPASS_STATS *)
                                 CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)),
            iVar1 != -1))) {
    in_stack_ffffffffffffffa0 =
         (AV1EncoderConfig *)
         calculate_modified_err
                   ((FRAME_INFO *)twopass_00,p,in_stack_ffffffffffffffa0,
                    (FIRSTPASS_STATS *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                   );
    accumulate_this_frame_stats
              (in_R8,(double)in_stack_ffffffffffffffa0,(GF_GROUP_STATS *)mod_frame_err);
    local_2c = local_2c + 1;
  }
  reset_fpf_position((TWO_PASS_FRAME *)(in_RDI + 0x13ac3),in_R9);
  input_stats(p,(TWO_PASS_FRAME *)in_stack_ffffffffffffffa0,
              (FIRSTPASS_STATS *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_2c = in_ESI;
  while ((local_2c <
          *(int *)((long)&stats->intra_error + (long)*(int *)((long)&stats->pcnt_neutral + 4) * 4)
         && (iVar1 = input_stats(p,(TWO_PASS_FRAME *)in_stack_ffffffffffffffa0,
                                 (FIRSTPASS_STATS *)
                                 CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)),
            iVar1 != -1))) {
    iVar1 = detect_flash(twopass_00,(TWO_PASS_FRAME *)p,
                         (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    in_stack_ffffffffffffff98 = in_ECX;
    accumulate_next_frame_stats
              (stats,(int)((ulong)plVar2 >> 0x20),(int)plVar2,(int)((ulong)twopass_00 >> 0x20),
               (GF_GROUP_STATS *)p,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),iVar1);
    local_2c = local_2c + 1;
  }
  iVar1 = *(int *)((long)&stats->intra_error + (long)*(int *)((long)&stats->pcnt_neutral + 4) * 4);
  average_gf_stats(iVar1,(GF_GROUP_STATS *)mod_frame_err);
  *(int *)&(oxcf->input_cfg).init_framerate = iVar1;
  return;
}

Assistant:

static void accumulate_gop_stats(AV1_COMP *cpi, int is_intra_only, int f_w,
                                 int f_h, FIRSTPASS_STATS *next_frame,
                                 const FIRSTPASS_STATS *start_pos,
                                 GF_GROUP_STATS *gf_stats, int *idx) {
  int i, flash_detected;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  RATE_CONTROL *const rc = &cpi->rc;
  FRAME_INFO *frame_info = &cpi->frame_info;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;

  init_gf_stats(gf_stats);
  av1_zero(*next_frame);

  // If this is a key frame or the overlay from a previous arf then
  // the error score / cost of this frame has already been accounted for.
  i = is_intra_only;
  // get the determined gf group length from p_rc->gf_intervals
  while (i < p_rc->gf_intervals[p_rc->cur_gf_index]) {
    // read in the next frame
    if (EOF == input_stats(twopass, &cpi->twopass_frame, next_frame)) break;
    // Accumulate error score of frames in this gf group.
    double mod_frame_err =
        calculate_modified_err(frame_info, twopass, oxcf, next_frame);
    // accumulate stats for this frame
    accumulate_this_frame_stats(next_frame, mod_frame_err, gf_stats);
    ++i;
  }

  reset_fpf_position(&cpi->twopass_frame, start_pos);

  i = is_intra_only;
  input_stats(twopass, &cpi->twopass_frame, next_frame);
  while (i < p_rc->gf_intervals[p_rc->cur_gf_index]) {
    // read in the next frame
    if (EOF == input_stats(twopass, &cpi->twopass_frame, next_frame)) break;

    // Test for the case where there is a brief flash but the prediction
    // quality back to an earlier frame is then restored.
    flash_detected = detect_flash(twopass, &cpi->twopass_frame, 0);

    // accumulate stats for next frame
    accumulate_next_frame_stats(next_frame, flash_detected,
                                rc->frames_since_key, i, gf_stats, f_w, f_h);

    ++i;
  }

  i = p_rc->gf_intervals[p_rc->cur_gf_index];
  average_gf_stats(i, gf_stats);

  *idx = i;
}